

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::erase
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  long lVar1;
  long lVar2;
  long lVar3;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  uint row_00;
  long lVar4;
  undefined4 local_6c;
  long local_68;
  long local_60;
  SearchKey local_58;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_50;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_48;
  long *local_40;
  undefined4 *local_38;
  
  local_68 = *(long *)this;
  local_6c = *(undefined4 *)&(row->content).ptr;
  lVar3 = (long)row - local_68;
  lVar4 = lVar3 >> 2;
  local_60 = *(long *)(this + 8) - local_68 >> 2;
  local_38 = &local_6c;
  local_40 = &local_68;
  local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00224bd0;
  row_00 = (uint)lVar4;
  local_50 = (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *)
             CONCAT44(local_50._4_4_,row_00);
  local_48 = this + 0x20;
  _::BTreeImpl::erase((BTreeImpl *)(this + 0x28),row_00,&local_58);
  local_68 = *(long *)this;
  lVar1 = *(long *)(this + 8);
  lVar2 = lVar1 - local_68 >> 2;
  if (lVar2 + -1 != lVar4) {
    local_6c = *(undefined4 *)(local_68 + -4 + lVar2 * 4);
    local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00224b90;
    local_48 = (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *)
               &local_68;
    local_40 = (long *)&local_6c;
    local_60 = lVar2;
    local_50 = this + 0x20;
    _::BTreeImpl::renumber((BTreeImpl *)(this + 0x28),(uint)(lVar2 + -1),row_00,&local_58);
    *(undefined4 *)(*(long *)this + lVar3) = *(undefined4 *)(*(long *)this + -4 + lVar2 * 4);
    lVar1 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar1 + -4;
  return;
}

Assistant:

void Table<Row, Indexes...>::erase(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  eraseImpl(&row - rows.begin());
}